

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::removeDependentEquations(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  HighsLogOptions *log_options_;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar1;
  HighsInt HVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  reference pvVar7;
  double dVar8;
  double *pdVar9;
  HighsPostsolveStack *this_00;
  size_t __nbytes;
  int __c;
  void *__buf;
  void *__buf_00;
  size_type sVar10;
  long *in_RDI;
  HighsTimerClock *factor_timer_clock_pointer;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  HighsLogOptions *log_options__00;
  HighsLogOptions *log_options__01;
  HighsInt redundant_row;
  HighsInt k;
  HighsInt num_fictitious_rows_skipped;
  HighsInt num_removed_nz;
  HighsInt num_removed_row;
  HighsInt rank_deficiency;
  double pct_off_timeout;
  HighsInt build_return;
  double time_taken;
  double time_limit;
  HFactor factor;
  vector<int,_std::allocator<int>_> colSet;
  HighsSliceNonzero *nonz;
  iterator __end2;
  iterator __begin2;
  HighsTripletTreeSlicePreOrder *__range2;
  HighsInt eq;
  pair<int,_int> *p;
  iterator __end1;
  iterator __begin1;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *__range1;
  HighsInt i;
  vector<int,_std::allocator<int>_> eqSet;
  HighsInt maxCapacity;
  HighsSparseMatrix matrix;
  bool logging_on;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5c0;
  undefined4 in_stack_fffffffffffff5c4;
  uint uVar11;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *in_stack_fffffffffffff5c8;
  HighsLogOptions *in_stack_fffffffffffff5d0;
  size_type in_stack_fffffffffffff5d8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff5e0;
  HPresolve *this_01;
  size_type in_stack_fffffffffffff5e8;
  HPresolve *in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f8;
  value_type in_stack_fffffffffffff5fc;
  HFactor *in_stack_fffffffffffff600;
  undefined8 in_stack_fffffffffffff618;
  HPresolveAnalysis *in_stack_fffffffffffff620;
  reference in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff630;
  int in_stack_fffffffffffff634;
  int local_9a4;
  uint local_9a0;
  uint local_99c;
  uint local_998;
  double local_978;
  HFactor *pHVar12;
  vector<int,_std::allocator<int>_> local_910 [50];
  undefined1 local_1c9 [33];
  double local_1a8;
  reference local_1a0;
  iterator local_198;
  iterator local_158;
  int local_118 [10];
  int *local_f0;
  int local_e4;
  reference local_e0;
  _Self local_d8;
  _Self local_d0;
  long *local_c8;
  int local_c0;
  vector<int,_std::allocator<int>_> local_b8;
  int local_a0;
  uint local_8c;
  int local_88;
  vector<int,_std::allocator<int>_> local_80 [3];
  byte local_19;
  Result local_4;
  
  HVar2 = (HighsInt)((ulong)in_stack_fffffffffffff618 >> 0x20);
  local_19 = *(byte *)((long)in_RDI + 0x691) & 1;
  bVar1 = std::
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::empty((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)0x711342);
  if (bVar1) {
    local_4 = kOk;
  }
  else {
    if ((local_19 & 1) != 0) {
      HPresolveAnalysis::startPresolveRuleLog(in_stack_fffffffffffff620,HVar2);
    }
    HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffff5f0);
    sVar4 = std::
            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::size((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    *)0x71139c);
    local_8c = (uint)sVar4;
    local_88 = *(int *)*in_RDI + 1;
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_80,0);
    *pvVar5 = 0;
    HVar2 = numNonzeros((HPresolve *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
    local_a0 = HVar2 + local_8c;
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5f0,
               in_stack_fffffffffffff5e8);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5f0,
               in_stack_fffffffffffff5e8);
    std::allocator<int>::allocator((allocator<int> *)0x71146e);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,
               (allocator_type *)in_stack_fffffffffffff5d0);
    std::allocator<int>::~allocator((allocator<int> *)0x71149a);
    local_c0 = 0;
    local_c8 = in_RDI + 0xa8;
    local_d0._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::begin((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  *)in_stack_fffffffffffff5b8._M_current);
    local_d8._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                *)in_stack_fffffffffffff5b8._M_current);
    while (bVar1 = std::operator!=(&local_d0,&local_d8), bVar1) {
      local_e0 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator*
                           ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)0x711510);
      in_stack_fffffffffffff634 = local_e0->second;
      sVar10 = (size_type)local_c0;
      local_c0 = local_c0 + 1;
      local_e4 = in_stack_fffffffffffff634;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,sVar10);
      *pvVar5 = in_stack_fffffffffffff634;
      getRowVector(in_stack_fffffffffffff5f0,(HighsInt)(in_stack_fffffffffffff5e8 >> 0x20));
      local_f0 = local_118;
      HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(in_stack_fffffffffffff5c8);
      HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::end
                ((HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)
                 in_stack_fffffffffffff5b8._M_current);
      while( true ) {
        bVar1 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator!=
                          (&local_158,&local_198);
        in_stack_fffffffffffff630 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff630);
        if (!bVar1) break;
        in_stack_fffffffffffff628 =
             HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator*(&local_158);
        local_1a0 = in_stack_fffffffffffff628;
        local_1a8 = HighsSliceNonzero::value(in_stack_fffffffffffff628);
        pdVar9 = &local_1a8;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                   (value_type_conflict1 *)in_stack_fffffffffffff5b8._M_current);
        pcVar6 = HighsSliceNonzero::index(local_1a0,(char *)pdVar9,__c);
        local_1c9._29_4_ = SUB84(pcVar6,0);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                   in_stack_fffffffffffff5b8._M_current);
        HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++
                  ((iterator *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
      }
      HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x7115ef);
      HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x7115fc);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)local_e4
                         );
      if ((*pvVar7 != 0.0) || (NAN(*pvVar7))) {
        in_stack_fffffffffffff600 = (HFactor *)&stack0xffffffffffffffc8;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)local_e4);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5d0,
                   (value_type_conflict1 *)in_stack_fffffffffffff5c8);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5d0,
                   (value_type_conflict2 *)in_stack_fffffffffffff5c8);
      }
      sVar10 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffc8);
      in_stack_fffffffffffff5fc = (value_type)sVar10;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_80,(long)local_c0);
      *pvVar5 = in_stack_fffffffffffff5fc;
      std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)
                 CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
    }
    dVar8 = (double)(long)(int)local_8c;
    pHVar12 = (HFactor *)local_1c9;
    std::allocator<int>::allocator((allocator<int> *)0x71184b);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,
               (allocator_type *)in_stack_fffffffffffff5d0);
    HVar2 = (HighsInt)(in_stack_fffffffffffff5d8 >> 0x20);
    std::allocator<int>::~allocator((allocator<int> *)0x711871);
    this_01 = (HPresolve *)(local_1c9 + 1);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5b8._M_current);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5b8._M_current);
    __first._M_current._4_4_ = in_stack_fffffffffffff5c4;
    __first._M_current._0_4_ = in_stack_fffffffffffff5c0;
    std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (__first,in_stack_fffffffffffff5b8,0);
    HFactor::HFactor(pHVar12);
    HFactor::setup(in_stack_fffffffffffff600,
                   (HighsSparseMatrix *)
                   CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                   (vector<int,_std::allocator<int>_> *)pHVar12,dVar8,(double)this_01,HVar2,
                   in_stack_fffffffffffff5d0);
    pHVar12 = (HFactor *)0x3ff0000000000000;
    factor_timer_clock_pointer = (HighsTimerClock *)(*(double *)(in_RDI[1] + 0x88) * 0.01);
    local_978 = 1000.0;
    pdVar9 = std::min<double>((double *)&stack0xfffffffffffff690,&local_978);
    this_00 = (HighsPostsolveStack *)std::max<double>((double *)&stack0xfffffffffffff698,pdVar9);
    log_options_ = (HighsLogOptions *)this_00->debug_prev_numreductions;
    HFactor::setTimeLimit((HFactor *)&stack0xfffffffffffff6a8,(double)log_options_);
    __nbytes = (size_t)local_8c;
    highsLogUser(log_options_,(HighsLogType)(in_RDI[1] + 0x380),(char *)0x1,
                 "Dependent equations search running on %d equations with time limit of %.2fs\n");
    HighsTimer::read((HighsTimer *)in_RDI[2],0,__buf,__nbytes);
    dVar8 = extraout_XMM0_Qa;
    uVar3 = HFactor::build(pHVar12,factor_timer_clock_pointer);
    uVar11 = uVar3;
    HighsTimer::read((HighsTimer *)in_RDI[2],0,__buf_00,(ulong)uVar3);
    HVar2 = (HighsInt)((ulong)in_stack_fffffffffffff628 >> 0x20);
    log_options__00 = (HighsLogOptions *)(extraout_XMM0_Qa_00 + -extraout_XMM0_Qa);
    if (uVar3 == 0xffffffff) {
      highsLogUser(log_options__00,(HighsLogType)(in_RDI[1] + 0x380),(char *)0x1,
                   "Dependent equations search terminated after %.3gs due to expected time exceeding limit\n"
                  );
      *(byte *)((long)in_RDI + 0x691) = local_19 & 1;
      if ((local_19 & 1) != 0) {
        HPresolveAnalysis::stopPresolveRuleLog
                  ((HPresolveAnalysis *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),HVar2);
      }
    }
    else {
      log_options__01 =
           (HighsLogOptions *)
           ((ABS((double)log_options__00 - (double)log_options_) * 100.0) / (double)log_options_);
      if ((double)log_options__01 < 1.0) {
        highsLogUser(log_options__01,(HighsLogType)log_options_,(char *)(in_RDI[1] + 0x380),4,
                     "Dependent equations search finished within %.2f%% of limit of %.2fs: risk of non-deterministic behaviour if solve is repeated\n"
                    );
      }
      local_998 = 0;
      local_99c = 0;
      local_9a0 = 0;
      for (local_9a4 = 0; HVar2 = (HighsInt)((ulong)in_stack_fffffffffffff628 >> 0x20),
          local_9a4 < (int)uVar3; local_9a4 = local_9a4 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_910,(long)local_9a4);
        if (*pvVar5 < 0) {
          local_9a0 = local_9a0 + 1;
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_910,(long)local_9a4);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)*pvVar5);
          local_998 = local_998 + 1;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)*pvVar5);
          local_99c = local_99c + *pvVar5;
          HighsPostsolveStack::redundantRow(this_00,(HighsInt)((ulong)dVar8 >> 0x20));
          removeRow(this_01,(HighsInt)((ulong)pdVar9 >> 0x20));
        }
      }
      highsLogUser(log_options__00,(HighsLogType)log_options_,(char *)(in_RDI[1] + 0x380),1,
                   "Dependent equations search removed %d rows and %d nonzeros in %.2fs (limit = %.2fs)\n"
                   ,(ulong)local_998,(ulong)local_99c);
      if (local_9a0 != 0) {
        highsLogDev((HighsLogOptions *)(in_RDI[1] + 0x380),kInfo,", avoiding %d fictitious rows",
                    (ulong)local_9a0);
      }
      highsLogDev((HighsLogOptions *)(in_RDI[1] + 0x380),kInfo,"\n");
      *(byte *)((long)in_RDI + 0x691) = local_19 & 1;
      if ((local_19 & 1) != 0) {
        HPresolveAnalysis::stopPresolveRuleLog
                  ((HPresolveAnalysis *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),HVar2);
      }
    }
    local_4 = kOk;
    HFactor::~HFactor((HFactor *)CONCAT44(uVar11,in_stack_fffffffffffff5c0));
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    HighsSparseMatrix::~HighsSparseMatrix
              ((HighsSparseMatrix *)CONCAT44(uVar11,in_stack_fffffffffffff5c0));
  }
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::removeDependentEquations(
    HighsPostsolveStack& postsolve_stack) {
  assert(analysis_.allow_rule_[kPresolveRuleDependentEquations]);
  const bool logging_on = analysis_.logging_on_;
  if (equations.empty()) return Result::kOk;

  if (logging_on)
    analysis_.startPresolveRuleLog(kPresolveRuleDependentEquations);

  HighsSparseMatrix matrix;
  matrix.num_col_ = equations.size();
  matrix.num_row_ = model->num_col_ + 1;
  matrix.start_.resize(matrix.num_col_ + 1);
  matrix.start_[0] = 0;
  const HighsInt maxCapacity = numNonzeros() + matrix.num_col_;
  matrix.value_.reserve(maxCapacity);
  matrix.index_.reserve(maxCapacity);

  std::vector<HighsInt> eqSet(matrix.num_col_);
  HighsInt i = 0;
  for (const std::pair<HighsInt, HighsInt>& p : equations) {
    HighsInt eq = p.second;
    eqSet[i++] = eq;

    // add entries of equation
    for (const HighsSliceNonzero& nonz : getRowVector(eq)) {
      matrix.value_.push_back(nonz.value());
      matrix.index_.push_back(nonz.index());
    }

    // add entry for artificial rhs column
    if (model->row_lower_[eq] != 0.0) {
      matrix.value_.push_back(model->row_lower_[eq]);
      matrix.index_.push_back(model->num_col_);
    }

    matrix.start_[i] = matrix.value_.size();
  }
  std::vector<HighsInt> colSet(matrix.num_col_);
  std::iota(colSet.begin(), colSet.end(), 0);
  HFactor factor;
  factor.setup(matrix, colSet);
  // Set up a time limit to prevent the redundant rows factorization
  // taking forever.
  //
  // Allow no more than 1% of the time limit to be spent on removing
  // dependent equations, but ensure that there is some limit since
  // options->time_limit is infinity by default
  //
  // ToDo: This is strictly non-deterministic, but so conservative
  // that it'll only reap the cases when factor.build never finishes
  const double time_limit =
      std::max(1.0, std::min(0.01 * options->time_limit, 1000.0));
  factor.setTimeLimit(time_limit);
  // Determine rank deficiency of the equations
  highsLogUser(options->log_options, HighsLogType::kInfo,
               "Dependent equations search running on %d equations with time "
               "limit of %.2fs\n",
               static_cast<int>(matrix.num_col_), time_limit);
  double time_taken = -this->timer->read();
  HighsInt build_return = factor.build();
  time_taken += this->timer->read();
  if (build_return == kBuildKernelReturnTimeout) {
    // HFactor::build has timed out, so just return
    highsLogUser(options->log_options, HighsLogType::kInfo,
                 "Dependent equations search terminated after %.3gs due to "
                 "expected time exceeding limit\n",
                 time_taken);
    analysis_.logging_on_ = logging_on;
    if (logging_on)
      analysis_.stopPresolveRuleLog(kPresolveRuleDependentFreeCols);
    return Result::kOk;
  } else {
    double pct_off_timeout =
        1e2 * std::fabs(time_taken - time_limit) / time_limit;
    if (pct_off_timeout < 1.0)
      highsLogUser(options->log_options, HighsLogType::kWarning,
                   "Dependent equations search finished within %.2f%% of limit "
                   "of %.2fs: "
                   "risk of non-deterministic behaviour if solve is repeated\n",
                   pct_off_timeout, time_limit);
  }
  // build_return as rank_deficiency must be valid
  assert(build_return >= 0);
  const HighsInt rank_deficiency = build_return;
  // Analyse what's been removed
  HighsInt num_removed_row = 0;
  HighsInt num_removed_nz = 0;
  HighsInt num_fictitious_rows_skipped = 0;
  for (HighsInt k = 0; k < rank_deficiency; k++) {
    if (factor.var_with_no_pivot[k] >= 0) {
      HighsInt redundant_row = eqSet[factor.var_with_no_pivot[k]];
      num_removed_row++;
      num_removed_nz += rowsize[redundant_row];
      postsolve_stack.redundantRow(redundant_row);
      removeRow(redundant_row);
    } else {
      num_fictitious_rows_skipped++;
    }
  }
  highsLogUser(options->log_options, HighsLogType::kInfo,
               "Dependent equations search removed %d rows and %d nonzeros "
               "in %.2fs (limit = %.2fs)\n",
               static_cast<int>(num_removed_row),
               static_cast<int>(num_removed_nz), time_taken, time_limit);
  if (num_fictitious_rows_skipped)
    highsLogDev(options->log_options, HighsLogType::kInfo,
                ", avoiding %d fictitious rows",
                static_cast<int>(num_fictitious_rows_skipped));
  highsLogDev(options->log_options, HighsLogType::kInfo, "\n");

  analysis_.logging_on_ = logging_on;
  if (logging_on)
    analysis_.stopPresolveRuleLog(kPresolveRuleDependentEquations);
  return Result::kOk;
}